

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference ppiVar4;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_198;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_190;
  __normal_iterator<int_*const_*,_std::vector<int_*,_std::allocator<int_*>_>_> local_188;
  const_iterator it;
  vector<int_*,_std::allocator<int_*>_> result;
  int searchRectMax [5];
  int aiStack_148 [2];
  int searchRectMin [5];
  vector<int_*,_std::allocator<int_*>_> local_128;
  undefined1 local_110 [8];
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  tree;
  int *local_f0;
  int *local_e8;
  int *local_e0 [3];
  int *local_c8;
  undefined1 local_c0 [8];
  vector<int_*,_std::allocator<int_*>_> values;
  int e5 [5];
  int aiStack_88 [2];
  int e4 [5];
  int aiStack_68 [2];
  int e3 [5];
  int aiStack_48 [2];
  int e2 [5];
  int aiStack_28 [2];
  int e1 [5];
  int dim;
  
  e1[4] = 5;
  aiStack_28[0] = 1;
  aiStack_28[1] = 1;
  e1[0] = 1;
  e1[1] = 1;
  e1[2] = 1;
  aiStack_48[0] = 1;
  aiStack_48[1] = 1;
  e2[0] = 1;
  e2[1] = 1;
  e2[2] = 1;
  aiStack_68[0] = 1;
  aiStack_68[1] = 2;
  e3[0] = 2;
  e3[1] = 2;
  e3[2] = 9;
  aiStack_88[0] = 1;
  aiStack_88[1] = 1;
  e4[0] = 1;
  e4[1] = 2;
  e4[2] = 1;
  values.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x800000008;
  std::vector<int_*,_std::allocator<int_*>_>::vector
            ((vector<int_*,_std::allocator<int_*>_> *)local_c0);
  local_c8 = aiStack_28;
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)local_c0,&local_c8);
  local_e0[0] = aiStack_48;
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)local_c0,local_e0);
  local_e8 = aiStack_68;
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)local_c0,&local_e8);
  local_f0 = aiStack_88;
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)local_c0,&local_f0);
  tree.boundingBoxMax =
       (int *)&values.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)local_c0,&tree.boundingBoxMax);
  std::vector<int_*,_std::allocator<int_*>_>::vector
            (&local_128,(vector<int_*,_std::allocator<int_*>_> *)local_c0);
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::KDTree((KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
            *)local_110,&local_128);
  std::vector<int_*,_std::allocator<int_*>_>::~vector(&local_128);
  aiStack_148[0] = 0;
  aiStack_148[1] = 0;
  searchRectMin[0] = 0;
  searchRectMin[1] = 0;
  searchRectMin[2] = 0;
  result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x200000002;
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::queryRectangle((vector<int_*,_std::allocator<int_*>_> *)&it,
                   (KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                    *)local_110,aiStack_148,
                   (int *)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<((ostream *)&std::cout,"found ");
  sVar3 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)&it);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," entries:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_190._M_current =
       (int **)std::vector<int_*,_std::allocator<int_*>_>::begin
                         ((vector<int_*,_std::allocator<int_*>_> *)&it);
  __gnu_cxx::__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>>::
  __normal_iterator<int**>
            ((__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>> *)&local_188,
             &local_190);
  while( true ) {
    local_198._M_current =
         (int **)std::vector<int_*,_std::allocator<int_*>_>::end
                           ((vector<int_*,_std::allocator<int_*>_> *)&it);
    bVar1 = __gnu_cxx::operator!=(&local_188,&local_198);
    if (!bVar1) break;
    ppiVar4 = __gnu_cxx::
              __normal_iterator<int_*const_*,_std::vector<int_*,_std::allocator<int_*>_>_>::
              operator*(&local_188);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,**ppiVar4);
    poVar2 = std::operator<<(poVar2," ");
    ppiVar4 = __gnu_cxx::
              __normal_iterator<int_*const_*,_std::vector<int_*,_std::allocator<int_*>_>_>::
              operator*(&local_188);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*ppiVar4)[1]);
    poVar2 = std::operator<<(poVar2," ");
    ppiVar4 = __gnu_cxx::
              __normal_iterator<int_*const_*,_std::vector<int_*,_std::allocator<int_*>_>_>::
              operator*(&local_188);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*ppiVar4)[2]);
    poVar2 = std::operator<<(poVar2," ");
    ppiVar4 = __gnu_cxx::
              __normal_iterator<int_*const_*,_std::vector<int_*,_std::allocator<int_*>_>_>::
              operator*(&local_188);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*ppiVar4)[3]);
    poVar2 = std::operator<<(poVar2," ");
    ppiVar4 = __gnu_cxx::
              __normal_iterator<int_*const_*,_std::vector<int_*,_std::allocator<int_*>_>_>::
              operator*(&local_188);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*ppiVar4)[4]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<int_*const_*,_std::vector<int_*,_std::allocator<int_*>_>_>::
    operator++(&local_188);
  }
  std::vector<int_*,_std::allocator<int_*>_>::~vector((vector<int_*,_std::allocator<int_*>_> *)&it);
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::~KDTree((KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
             *)local_110);
  std::vector<int_*,_std::allocator<int_*>_>::~vector
            ((vector<int_*,_std::allocator<int_*>_> *)local_c0);
  return 1;
}

Assistant:

int main() {

	const int dim = 5;

	// prepare elements, five dimensional int arrays. we could also use e.g. doubles if we wanted.
	int e1[dim] = {1, 1, 1, 1, 1};
	int e2[dim] = {1, 1, 1, 1, 1};
	int e3[dim] = {1, 2, 2, 2, 9};
	int e4[dim] = {1, 1, 1, 2, 1};
	int e5[dim] = {8, 8, 8, 8, 8};

	// fill the elements into a vector
	std::vector<int*> values;
	values.push_back(e1);
	values.push_back(e2);
	values.push_back(e3);
	values.push_back(e4);
	values.push_back(e5);

	// build the tree. first template parameter is the type of the elements, second parameter is the number of dimensions
	kdtree::KDTree<int, dim> tree(values);

	// prepare search query. we search for elements whose values are between 0 and 2 on all dimensions
	int searchRectMin[5] = {0,0,0,0,0};
	int searchRectMax[5] = {2,2,2,2,2};

	// perform the search. result will contain the elements that match the query.
	std::vector<int*> result = tree.queryRectangle(searchRectMin, searchRectMax);

	// print results
	std::cout << "found " << result.size() << " entries:" << std::endl;
	for(std::vector<int*>::const_iterator it = result.begin(); it != result.end(); ++it) {
		std::cout << (*it)[0] << " " << (*it)[1] << " " << (*it)[2] << " " << (*it)[3]<< " " << (*it)[4] << std::endl;
	}

	return 1;
}